

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_image_load_bricks(nifti_image *nim,int nbricks,int *blist,nifti_brick_list *NBL)

{
  int iVar1;
  znzFile local_50;
  znzFile fp;
  int *piStack_40;
  int rv;
  int *sindex;
  int *slist;
  nifti_brick_list *NBL_local;
  int *blist_local;
  nifti_image *pnStack_18;
  int nbricks_local;
  nifti_image *nim_local;
  
  sindex = (int *)0x0;
  piStack_40 = (int *)0x0;
  slist = &NBL->nbricks;
  NBL_local = (nifti_brick_list *)blist;
  blist_local._4_4_ = nbricks;
  pnStack_18 = nim;
  if ((nim == (nifti_image *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",nim,NBL);
    nim_local._4_4_ = -1;
  }
  else {
    if ((blist != (int *)0x0) && (nbricks < 1)) {
      if (1 < g_opts.debug) {
        fprintf(_stderr,"-d load_bricks: received blist with nbricks = %d,ignoring blist\n",
                (ulong)(uint)nbricks);
      }
      NBL_local = (nifti_brick_list *)0x0;
    }
    if ((NBL_local != (nifti_brick_list *)0x0) &&
       (iVar1 = valid_nifti_brick_list
                          (pnStack_18,blist_local._4_4_,&NBL_local->nbricks,(uint)(0 < g_opts.debug)
                          ), iVar1 == 0)) {
      return -1;
    }
    if ((NBL_local != (nifti_brick_list *)0x0) &&
       (iVar1 = nifti_copynsort(blist_local._4_4_,&NBL_local->nbricks,&sindex,
                                &stack0xffffffffffffffc0), iVar1 != 0)) {
      return -1;
    }
    local_50 = nifti_image_load_prep(pnStack_18);
    if (local_50 == (znzFile)0x0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** nifti_image_load_bricks, failed load_prep\n");
      }
      if (NBL_local != (nifti_brick_list *)0x0) {
        free(sindex);
        free(piStack_40);
      }
      nim_local._4_4_ = -1;
    }
    else {
      if (NBL_local == (nifti_brick_list *)0x0) {
        blist_local._4_4_ = 0;
      }
      iVar1 = nifti_alloc_NBL_mem(pnStack_18,blist_local._4_4_,(nifti_brick_list *)slist);
      if (iVar1 == 0) {
        fp._4_4_ = nifti_load_NBL_bricks
                             (pnStack_18,sindex,piStack_40,(nifti_brick_list *)slist,local_50);
        if (fp._4_4_ != 0) {
          nifti_free_NBL((nifti_brick_list *)slist);
          *slist = 0;
        }
        if (sindex != (int *)0x0) {
          free(sindex);
          free(piStack_40);
        }
        Xznzclose(&local_50);
        nim_local._4_4_ = *slist;
      }
      else {
        if (NBL_local != (nifti_brick_list *)0x0) {
          free(sindex);
          free(piStack_40);
        }
        Xznzclose(&local_50);
        nim_local._4_4_ = -1;
      }
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_image_load_bricks( nifti_image * nim , int nbricks,
                             const int * blist, nifti_brick_list * NBL )
{
   int     * slist = NULL, * sindex = NULL, rv;
   znzFile   fp;

   /* we can have blist == NULL */
   if( !nim || !NBL ){
      fprintf(stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",
              (void *)nim, (void *)NBL);
      return -1;
   }

   if( blist && nbricks <= 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d load_bricks: received blist with nbricks = %d,"
                        "ignoring blist\n", nbricks);
      blist = NULL; /* pretend nothing was passed */
   }

   if( blist && ! valid_nifti_brick_list(nim, nbricks, blist, g_opts.debug>0) )
      return -1;

   /* for efficiency, let's read the file in order */
   if( blist && nifti_copynsort( nbricks, blist, &slist, &sindex ) != 0 )
      return -1;

   /* open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );
   if( !fp ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load_bricks, failed load_prep\n");
      if( blist ){ free(slist); free(sindex); }
      return -1;
   }

   /* this will flag to allocate defaults */
   if( !blist ) nbricks = 0;
   if( nifti_alloc_NBL_mem( nim, nbricks, NBL ) != 0 ){
      if( blist ){ free(slist); free(sindex); }
      znzclose(fp);
      return -1;
   }

   rv = nifti_load_NBL_bricks(nim, slist, sindex, NBL, fp);

   if( rv != 0 ){
      nifti_free_NBL( NBL );  /* failure! */
      NBL->nbricks = 0; /* repetative, but clear */
   }

   if( slist ){ free(slist); free(sindex); }

   znzclose(fp);

   return NBL->nbricks;
}